

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector3 * vector3_normalize(vector3 *self)

{
  short sVar1;
  float f1;
  float mag;
  vector3 *self_local;
  
  f1 = vector3_magnitude(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    (self->field_0).v[0] = (self->field_0).v[0] / f1;
    (self->field_0).v[1] = (self->field_0).v[1] / f1;
    (self->field_0).v[2] = (self->field_0).v[2] / f1;
  }
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_normalize(struct vector3 *self)
{
	HYP_FLOAT mag;

	mag = vector3_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;

	return self;
}